

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O1

void crec_alloc(jit_State *J,RecordFFData *rd,CTypeID id)

{
  CType *pCVar1;
  CType *pCVar2;
  ushort uVar3;
  CType *pCVar4;
  bool bVar5;
  CTInfo CVar6;
  TRef TVar7;
  TRef TVar8;
  CTSize k;
  CTSize CVar9;
  TRef TVar10;
  int iVar11;
  uint uVar12;
  cTValue *pcVar13;
  ulong uVar14;
  IRRef1 IVar15;
  ulong uVar16;
  CTSize in_R8D;
  CTypeID1 CVar17;
  CTState *pCVar18;
  CTSize sz;
  TValue tv;
  uint local_60;
  uint local_5c;
  TRef local_58;
  TRef local_54;
  RecordFFData *local_50;
  CTState *local_48;
  cTValue local_40;
  CTypeID local_34;
  
  pCVar18 = (CTState *)J[-1].penalty[0x3b].pc.ptr64;
  local_50 = rd;
  CVar6 = lj_ctype_info(pCVar18,id,&local_60);
  pCVar1 = pCVar18->tab + id;
  local_48 = pCVar18;
  TVar7 = lj_ir_kint(J,id);
  pCVar18 = local_48;
  if (((CVar6 & 0xf0000000) == 0x20000000) ||
     ((CVar6 < 0x4000000 && ((local_60 == 8 || (local_60 == 4)))))) {
    if (J->base[1] == 0) {
      if ((CVar6 & 0xf0000000) == 0x20000000) {
        TVar8 = lj_ir_kptr_(J,IR_KPTR,(void *)0x0);
        IVar15 = (IRRef1)TVar8;
      }
      else if (local_60 == 4) {
        TVar8 = lj_ir_kint(J,0);
        IVar15 = (IRRef1)TVar8;
      }
      else {
        TVar8 = lj_ir_kint64(J,0);
        IVar15 = (IRRef1)TVar8;
      }
    }
    else {
      TVar8 = crec_ct_tv(J,pCVar1,0,J->base[1],local_50->argv + 1);
      IVar15 = (IRRef1)TVar8;
    }
    (J->fold).ins.field_0.ot = 0x548a;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar7;
    (J->fold).ins.field_0.op2 = IVar15;
    TVar7 = lj_opt_fold(J);
    *J->base = TVar7;
    return;
  }
  local_34 = id;
  if ((CVar6 >> 0x14 & 1) == 0) {
    if ((CVar6 & 0xc0000) == 0) {
      TVar8 = 0x7fff;
    }
    else {
      TVar8 = lj_ir_kint(J,local_60);
    }
  }
  else {
    TVar8 = J->base[1];
    if ((TVar8 == 0) || (J->base[2] != 0)) goto LAB_0015be94;
    pcVar13 = local_50->argv + 1;
    local_54 = crec_ct_tv(J,local_48->tab + 9,0,TVar8,pcVar13);
    in_R8D = (CTSize)pcVar13;
    k = lj_ctype_vlsize(pCVar18,pCVar1,0);
    CVar9 = lj_ctype_vlsize(pCVar18,pCVar1,1);
    TVar8 = lj_ir_kint(J,CVar9 - k);
    (J->fold).ins.field_0.ot = 0x3793;
    (J->fold).ins.field_0.op1 = (IRRef1)local_54;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
    TVar8 = lj_opt_fold(J);
    TVar10 = lj_ir_kint(J,k);
    (J->fold).ins.field_0.ot = 0x3593;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
    TVar8 = lj_opt_fold(J);
    J->base[1] = 0;
  }
  (J->fold).ins.field_0.ot = 0x538a;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar7;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
  local_54 = lj_opt_fold(J);
  pCVar18 = local_48;
  IVar15 = (IRRef1)local_54;
  if (((CVar6 >> 0x14 & 1) == 0) && (local_60 < 0x81)) {
    if ((J->base[1] == 0) ||
       ((J->base[2] != 0 ||
        (iVar11 = lj_cconv_multi_init(local_48,pCVar1,local_50->argv + 1), iVar11 != 0)))) {
      uVar12 = pCVar1->info >> 0x1c;
      if (uVar12 == 1) {
        if ((J->base[1] == 0) && (CVar17 = pCVar1->sib, CVar17 != 0)) {
          pCVar4 = pCVar18->tab;
          do {
            uVar12 = pCVar4[CVar17].info >> 0x1c;
            if (uVar12 == 0xb) {
LAB_0015bf8b:
              iVar11 = 0;
            }
            else {
              iVar11 = 2;
              if (uVar12 == 9) {
                if (pCVar4[CVar17].name.gcptr64 == 0) {
                  iVar11 = 7;
LAB_0015bf84:
                  bVar5 = false;
                }
                else {
                  if (((0xfffffff < pCVar4[(ushort)pCVar4[CVar17].info].info) &&
                      (uVar12 = pCVar4[(ushort)pCVar4[CVar17].info].info >> 0x1c, uVar12 != 5)) &&
                     (uVar12 != 2)) {
                    iVar11 = 2;
                    goto LAB_0015bf84;
                  }
                  iVar11 = 0;
                  bVar5 = true;
                }
                if (bVar5) goto LAB_0015bf8b;
              }
            }
            CVar17 = pCVar4[CVar17].sib;
            if ((iVar11 != 7) && (iVar11 != 0)) goto LAB_0015bc55;
          } while (CVar17 != 0);
        }
        uVar16 = 1;
        CVar17 = pCVar1->sib;
        do {
          if (CVar17 == 0) break;
          pCVar4 = pCVar18->tab;
          uVar3 = pCVar4[CVar17].sib;
          uVar12 = pCVar4[CVar17].info >> 0x1c;
          if (uVar12 == 0xb) {
LAB_0015bde3:
            bVar5 = false;
          }
          else {
            if (uVar12 != 9) goto LAB_0015be94;
            pCVar2 = pCVar4 + CVar17;
            local_40.u64 = 0;
            if ((pCVar2->name).gcptr64 == 0) goto LAB_0015bde3;
            pCVar4 = pCVar4 + (ushort)pCVar2->info;
            uVar12 = pCVar4->info;
            if (((0xfffffff < uVar12) && (uVar12 >> 0x1c != 2)) && (uVar12 >> 0x1c != 5))
            goto LAB_0015be94;
            local_5c = (uint)uVar16;
            if (J->base[uVar16] == 0) {
              if ((uVar12 & 0xf0000000) == 0x20000000) {
                local_58 = 0x7fff;
              }
              else {
                local_58 = lj_ir_kint(J,0);
              }
              pcVar13 = &local_40;
            }
            else {
              pcVar13 = local_50->argv + uVar16;
              local_5c = local_5c + 1;
              local_58 = J->base[uVar16];
            }
            TVar7 = lj_ir_kint64(J,(ulong)pCVar2->size + 0x10);
            (J->fold).ins.field_0.ot = 0x2909;
            (J->fold).ins.field_0.op1 = (IRRef1)local_54;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
            TVar7 = lj_opt_fold(J);
            crec_ct_tv(J,pCVar4,TVar7,local_58,pcVar13);
            pCVar18 = local_48;
            if ((pCVar1->info & 0x800000) == 0) {
              bVar5 = false;
              uVar16 = (ulong)local_5c;
            }
            else {
              bVar5 = true;
              uVar16 = (ulong)local_5c;
              if (pCVar1->size != pCVar4->size) goto LAB_0015be94;
            }
          }
          CVar17 = uVar3;
        } while (!bVar5);
        goto LAB_0015bec9;
      }
      if (uVar12 == 3) {
        pCVar1 = pCVar18->tab + (ushort)pCVar1->info;
        local_40.u64 = 0;
        if ((pCVar1->info < 0x10000000 || (pCVar1->info & 0xf0000000) == 0x20000000) &&
           (local_60 <= pCVar1->size << 4)) {
          pCVar18 = local_48;
          if (local_60 != 0) {
            local_5c = 1;
            pcVar13 = &local_40;
            uVar16 = 0;
            TVar7 = 0;
            local_58 = pCVar1->size;
            do {
              TVar8 = lj_ir_kint64(J,uVar16 + 0x10);
              (J->fold).ins.field_0.ot = 0x2909;
              (J->fold).ins.field_0.op1 = (IRRef1)local_54;
              (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
              TVar8 = lj_opt_fold(J);
              uVar14 = (ulong)local_5c;
              if (J->base[uVar14] == 0) {
                if (local_5c == 2) {
                  local_5c = 2;
                }
                else {
                  TVar7 = 0x7fff;
                  if (pCVar1->info < 0x10000000) {
                    TVar7 = lj_ir_kint(J,0);
                  }
                }
              }
              else {
                pcVar13 = local_50->argv + uVar14;
                local_5c = local_5c + 1;
                TVar7 = J->base[uVar14];
              }
              crec_ct_tv(J,pCVar1,TVar8,TVar7,pcVar13);
              uVar12 = (int)uVar16 + local_58;
              uVar16 = (ulong)uVar12;
              pCVar18 = local_48;
            } while (uVar12 < local_60);
          }
          goto LAB_0015bec9;
        }
        goto LAB_0015bc55;
      }
    }
    TVar7 = lj_ir_kint64(J,0x10);
    (J->fold).ins.field_0.ot = 0x2909;
    (J->fold).ins.field_0.op1 = IVar15;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
    TVar8 = lj_opt_fold(J);
    TVar7 = J->base[1];
    if (TVar7 == 0) {
      pcVar13 = &local_40;
      local_40.u64 = 0;
      TVar7 = lj_ir_kint(J,0);
    }
    else {
      pcVar13 = local_50->argv + 1;
    }
    crec_ct_tv(J,pCVar1,TVar8,TVar7,pcVar13);
  }
  else {
LAB_0015bc55:
    if (J->base[1] != 0) {
LAB_0015be94:
      lj_trace_err(J,LJ_TRERR_NYICONV);
    }
    TVar7 = lj_ir_kint64(J,0x10);
    (J->fold).ins.field_0.ot = 0x2909;
    (J->fold).ins.field_0.op1 = IVar15;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
    TVar7 = lj_opt_fold(J);
    if (TVar8 == 0x7fff) {
      TVar8 = lj_ir_kint(J,local_60);
    }
    TVar10 = lj_ir_kint(J,0);
    crec_fill(J,TVar7,TVar8,TVar10,in_R8D);
  }
LAB_0015bec9:
  TVar7 = local_54;
  *J->base = local_54;
  pcVar13 = lj_ctype_meta(pCVar18,local_34,MM_gc);
  if (pcVar13 != (cTValue *)0x0) {
    crec_finalizer(J,TVar7,0,pcVar13);
  }
  return;
}

Assistant:

static void crec_alloc(jit_State *J, RecordFFData *rd, CTypeID id)
{
  CTState *cts = ctype_ctsG(J2G(J));
  CTSize sz;
  CTInfo info = lj_ctype_info(cts, id, &sz);
  CType *d = ctype_raw(cts, id);
  TRef trcd, trid = lj_ir_kint(J, id);
  cTValue *fin;
  /* Use special instruction to box pointer or 32/64 bit integer. */
  if (ctype_isptr(info) || (ctype_isinteger(info) && (sz == 4 || sz == 8))) {
    TRef sp = J->base[1] ? crec_ct_tv(J, d, 0, J->base[1], &rd->argv[1]) :
	      ctype_isptr(info) ? lj_ir_kptr(J, NULL) :
	      sz == 4 ? lj_ir_kint(J, 0) :
	      (lj_needsplit(J), lj_ir_kint64(J, 0));
    J->base[0] = emitir(IRTG(IR_CNEWI, IRT_CDATA), trid, sp);
    return;
  } else {
    TRef trsz = TREF_NIL;
    if ((info & CTF_VLA)) {  /* Calculate VLA/VLS size at runtime. */
      CTSize sz0, sz1;
      if (!J->base[1] || J->base[2])
	lj_trace_err(J, LJ_TRERR_NYICONV);  /* NYI: init VLA/VLS. */
      trsz = crec_ct_tv(J, ctype_get(cts, CTID_INT32), 0,
			J->base[1], &rd->argv[1]);
      sz0 = lj_ctype_vlsize(cts, d, 0);
      sz1 = lj_ctype_vlsize(cts, d, 1);
      trsz = emitir(IRTGI(IR_MULOV), trsz, lj_ir_kint(J, (int32_t)(sz1-sz0)));
      trsz = emitir(IRTGI(IR_ADDOV), trsz, lj_ir_kint(J, (int32_t)sz0));
      J->base[1] = 0;  /* Simplify logic below. */
    } else if (ctype_align(info) > CT_MEMALIGN) {
      trsz = lj_ir_kint(J, sz);
    }
    trcd = emitir(IRTG(IR_CNEW, IRT_CDATA), trid, trsz);
    if (sz > 128 || (info & CTF_VLA)) {
      TRef dp;
      CTSize align;
    special:  /* Only handle bulk zero-fill for large/VLA/VLS types. */
      if (J->base[1])
	lj_trace_err(J, LJ_TRERR_NYICONV);  /* NYI: init large/VLA/VLS types. */
      dp = emitir(IRT(IR_ADD, IRT_PTR), trcd, lj_ir_kintp(J, sizeof(GCcdata)));
      if (trsz == TREF_NIL) trsz = lj_ir_kint(J, sz);
      align = ctype_align(info);
      if (align < CT_MEMALIGN) align = CT_MEMALIGN;
      crec_fill(J, dp, trsz, lj_ir_kint(J, 0), (1u << align));
    } else if (J->base[1] && !J->base[2] &&
	!lj_cconv_multi_init(cts, d, &rd->argv[1])) {
      goto single_init;
    } else if (ctype_isarray(d->info)) {
      CType *dc = ctype_rawchild(cts, d);  /* Array element type. */
      CTSize ofs, esize = dc->size;
      TRef sp = 0;
      TValue tv;
      TValue *sval = &tv;
      MSize i;
      tv.u64 = 0;
      if (!(ctype_isnum(dc->info) || ctype_isptr(dc->info)) ||
	  esize * CREC_FILL_MAXUNROLL < sz)
	goto special;
      for (i = 1, ofs = 0; ofs < sz; ofs += esize) {
	TRef dp = emitir(IRT(IR_ADD, IRT_PTR), trcd,
			 lj_ir_kintp(J, ofs + sizeof(GCcdata)));
	if (J->base[i]) {
	  sp = J->base[i];
	  sval = &rd->argv[i];
	  i++;
	} else if (i != 2) {
	  sp = ctype_isnum(dc->info) ? lj_ir_kint(J, 0) : TREF_NIL;
	}
	crec_ct_tv(J, dc, dp, sp, sval);
      }
    } else if (ctype_isstruct(d->info)) {
      CTypeID fid;
      MSize i = 1;
      if (!J->base[1]) {  /* Handle zero-fill of struct-of-NYI. */
	fid = d->sib;
	while (fid) {
	  CType *df = ctype_get(cts, fid);
	  fid = df->sib;
	  if (ctype_isfield(df->info)) {
	    CType *dc;
	    if (!gcref(df->name)) continue;  /* Ignore unnamed fields. */
	    dc = ctype_rawchild(cts, df);  /* Field type. */
	    if (!(ctype_isnum(dc->info) || ctype_isptr(dc->info) ||
		  ctype_isenum(dc->info)))
	      goto special;
	  } else if (!ctype_isconstval(df->info)) {
	    goto special;
	  }
	}
      }
      fid = d->sib;
      while (fid) {
	CType *df = ctype_get(cts, fid);
	fid = df->sib;
	if (ctype_isfield(df->info)) {
	  CType *dc;
	  TRef sp, dp;
	  TValue tv;
	  TValue *sval = &tv;
	  setintV(&tv, 0);
	  if (!gcref(df->name)) continue;  /* Ignore unnamed fields. */
	  dc = ctype_rawchild(cts, df);  /* Field type. */
	  if (!(ctype_isnum(dc->info) || ctype_isptr(dc->info) ||
		ctype_isenum(dc->info)))
	    lj_trace_err(J, LJ_TRERR_NYICONV);  /* NYI: init aggregates. */
	  if (J->base[i]) {
	    sp = J->base[i];
	    sval = &rd->argv[i];
	    i++;
	  } else {
	    sp = ctype_isptr(dc->info) ? TREF_NIL : lj_ir_kint(J, 0);
	  }
	  dp = emitir(IRT(IR_ADD, IRT_PTR), trcd,
		      lj_ir_kintp(J, df->size + sizeof(GCcdata)));
	  crec_ct_tv(J, dc, dp, sp, sval);
	  if ((d->info & CTF_UNION)) {
	    if (d->size != dc->size)  /* NYI: partial init of union. */
	      lj_trace_err(J, LJ_TRERR_NYICONV);
	    break;
	  }
	} else if (!ctype_isconstval(df->info)) {
	  /* NYI: init bitfields and sub-structures. */
	  lj_trace_err(J, LJ_TRERR_NYICONV);
	}
      }
    } else {
      TRef dp;
    single_init:
      dp = emitir(IRT(IR_ADD, IRT_PTR), trcd, lj_ir_kintp(J, sizeof(GCcdata)));
      if (J->base[1]) {
	crec_ct_tv(J, d, dp, J->base[1], &rd->argv[1]);
      } else {
	TValue tv;
	tv.u64 = 0;
	crec_ct_tv(J, d, dp, lj_ir_kint(J, 0), &tv);
      }
    }
  }
  J->base[0] = trcd;
  /* Handle __gc metamethod. */
  fin = lj_ctype_meta(cts, id, MM_gc);
  if (fin)
    crec_finalizer(J, trcd, 0, fin);
}